

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cpp
# Opt level: O1

void __thiscall HttpData::HttpData(HttpData *this,EventLoop *loop,int connfd)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  Channel *this_01;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  (this->super_enable_shared_from_this<HttpData>)._M_weak_this.
  super___weak_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<HttpData>)._M_weak_this.
  super___weak_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->loop_ = loop;
  this_01 = (Channel *)operator_new(0xa8);
  Channel::Channel(this_01,loop,connfd);
  (this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_01;
  this_00 = &(this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Channel*>(this_00,this_01);
  this->fd_ = connfd;
  local_40 = &(this->inBuffer_).field_2;
  (this->inBuffer_)._M_dataplus._M_p = (pointer)local_40;
  (this->inBuffer_)._M_string_length = 0;
  (this->inBuffer_).field_2._M_local_buf[0] = '\0';
  local_48 = &(this->outBuffer_).field_2;
  (this->outBuffer_)._M_dataplus._M_p = (pointer)local_48;
  (this->outBuffer_)._M_string_length = 0;
  (this->outBuffer_).field_2._M_local_buf[0] = '\0';
  this->error_ = false;
  this->connectionState_ = H_CONNECTED;
  this->method_ = METHOD_GET;
  this->HTTPVersion_ = HTTP_11;
  (this->fileName_)._M_dataplus._M_p = (pointer)&(this->fileName_).field_2;
  (this->fileName_)._M_string_length = 0;
  (this->fileName_).field_2._M_local_buf[0] = '\0';
  (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
  (this->path_)._M_string_length = 0;
  (this->path_).field_2._M_local_buf[0] = '\0';
  this->nowReadPos_ = 0;
  this->state_ = STATE_PARSE_URI;
  this->hState_ = H_START;
  this->keepAlive_ = false;
  p_Var1 = &(this->headers_)._M_t._M_impl.super__Rb_tree_header;
  (this->headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->timer_).super___weak_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->headers_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->timer_).super___weak_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  peVar2 = (this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_38 = this_00;
  local_68._M_unused._M_object = operator_new(0x18);
  *(code **)local_68._M_unused._0_8_ = handleRead;
  *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = 0;
  *(HttpData **)((long)local_68._M_unused._0_8_ + 0x10) = this;
  pcStack_50 = std::_Function_handler<void_(),_std::_Bind<void_(HttpData::*(HttpData_*))()>_>::
               _M_invoke;
  local_58 = std::_Function_handler<void_(),_std::_Bind<void_(HttpData::*(HttpData_*))()>_>::
             _M_manager;
  std::function<void_()>::operator=(&peVar2->readHandler_,(function<void_()> *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  peVar2 = (this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_68._M_unused._M_object = operator_new(0x18);
  *(code **)local_68._M_unused._0_8_ = handleWrite;
  *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = 0;
  *(HttpData **)((long)local_68._M_unused._0_8_ + 0x10) = this;
  pcStack_50 = std::_Function_handler<void_(),_std::_Bind<void_(HttpData::*(HttpData_*))()>_>::
               _M_invoke;
  local_58 = std::_Function_handler<void_(),_std::_Bind<void_(HttpData::*(HttpData_*))()>_>::
             _M_manager;
  std::function<void_()>::operator=(&peVar2->writeHandler_,(function<void_()> *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  peVar2 = (this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_68._M_unused._M_object = operator_new(0x18);
  *(code **)local_68._M_unused._0_8_ = handleConn;
  *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = 0;
  *(HttpData **)((long)local_68._M_unused._0_8_ + 0x10) = this;
  pcStack_50 = std::_Function_handler<void_(),_std::_Bind<void_(HttpData::*(HttpData_*))()>_>::
               _M_invoke;
  local_58 = std::_Function_handler<void_(),_std::_Bind<void_(HttpData::*(HttpData_*))()>_>::
             _M_manager;
  std::function<void_()>::operator=(&peVar2->connHandler_,(function<void_()> *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  return;
}

Assistant:

HttpData::HttpData(EventLoop* loop, int connfd)
        :loop_(loop),
        channel_(new Channel(loop,connfd)),
        fd_(connfd),
        error_(false),
        connectionState_(H_CONNECTED),
        method_(METHOD_GET),
        HTTPVersion_(HTTP_11),
        nowReadPos_(0),
        state_(STATE_PARSE_URI),
        hState_(H_START),
        keepAlive_(false) {
            channel_->setReadHandler(bind(&HttpData::handleRead, this));
            channel_->setWriteHandler(bind(&HttpData::handleWrite, this));
            channel_->setConnHandler(bind(&HttpData::handleConn, this));
}